

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O1

int do_dec(void)

{
  byte bVar1;
  byte bVar2;
  vm_register *pvVar3;
  undefined4 *puVar4;
  short sVar5;
  uint uVar6;
  char cVar7;
  bool bVar8;
  
  pvVar3 = registe_ptr;
  bVar1 = code_ptr[registe_ptr->IP + 1];
  bVar2 = bVar1 >> 4;
  if ((bVar1 & 0xf) == 2) {
    uVar6 = *register_list[bVar2] - 1;
    *register_list[bVar2] = uVar6;
    if (uVar6 != 0) {
      pvVar3->flag[0] = '\x01';
      if (0 < (int)uVar6) {
        pvVar3->flag[1] = '\x01';
        return 1;
      }
      pvVar3->flag[1] = '\0';
      return 1;
    }
LAB_0010341b:
    pvVar3->flag[0] = '\0';
  }
  else {
    if ((bVar1 & 0xf) == 1) {
      sVar5 = (short)*register_list[bVar2] + -1;
      *(short *)register_list[bVar2] = sVar5;
      if (sVar5 == 0) goto LAB_0010341b;
      bVar8 = sVar5 < 0;
      if (0 < sVar5) goto LAB_001033ef;
    }
    else {
      if ((bVar1 & 0xf) != 0) {
        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar4 = 0xf6;
        __cxa_throw(puVar4,&int::typeinfo,0);
      }
      cVar7 = (char)*register_list[bVar2] + -1;
      *(char *)register_list[bVar2] = cVar7;
      pvVar3 = registe_ptr;
      if (cVar7 == '\0') goto LAB_0010341b;
      bVar8 = cVar7 < '\0';
      if ('\0' < cVar7) {
LAB_001033ef:
        pvVar3->flag[0] = '\x01';
        pvVar3->flag[1] = '\x01';
        return 1;
      }
    }
    if (bVar8) {
      pvVar3->flag[0] = '\x01';
      pvVar3->flag[1] = '\0';
    }
  }
  return 1;
}

Assistant:

int do_dec() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 1] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;
	switch (low)
	{
	case 0: {
		char*Ra = (char *)register_list[high];
		--*Ra;
		set_flag(*Ra);
		break;
	}
	case 1: {
		int16_t *Ra = (int16_t *)register_list[high];
		--*Ra;
		set_flag(*Ra);
		break;
	}
	case 2: {
		unsigned *Ra = (unsigned *)register_list[high];
		--*Ra;
		set_flag(*Ra);
		break;
	}
	default:
	{
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;
}